

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

parameter_trie_ptr __thiscall
boost::runtime::cla::rt_cla_detail::parameter_trie::get_subtrie(parameter_trie *this,char c)

{
  _Base_ptr p_Var1;
  const_iterator cVar2;
  shared_count extraout_RDX;
  undefined7 in_register_00000031;
  parameter_trie_ptr pVar3;
  key_type_conflict local_11;
  
  cVar2 = std::
          _Rb_tree<char,_std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>,_std::_Select1st<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
          ::find((_Rb_tree<char,_std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>,_std::_Select1st<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
                  *)CONCAT71(in_register_00000031,c),&local_11);
  if ((_Rb_tree_header *)cVar2._M_node ==
      &(((_Rb_tree<char,_std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>,_std::_Select1st<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
          *)CONCAT71(in_register_00000031,c))->_M_impl).super__Rb_tree_header) {
    *(undefined8 *)&(this->m_subtrie)._M_t._M_impl = 0;
    *(undefined8 *)&(this->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  }
  else {
    *(_Base_ptr *)&(this->m_subtrie)._M_t._M_impl = cVar2._M_node[1]._M_parent;
    p_Var1 = cVar2._M_node[1]._M_left;
    *(_Base_ptr *)&(this->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header = p_Var1;
    if (p_Var1 != (_Base_ptr)0x0) {
      LOCK();
      *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
      UNLOCK();
    }
  }
  pVar3.pn.pi_ = extraout_RDX.pi_;
  pVar3.px = this;
  return pVar3;
}

Assistant:

parameter_trie_ptr  get_subtrie( char c ) const
    {
        trie_per_char::const_iterator it = m_subtrie.find( c );

        return it != m_subtrie.end() ? it->second : parameter_trie_ptr();
    }